

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initiate_post.hpp
# Opt level: O2

void __thiscall
asio::detail::initiate_post_with_executor<asio::any_io_executor>::operator()
          (initiate_post_with_executor<asio::any_io_executor> *this,
          binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *handler,
          enable_if_t<execution::is_executor<conditional_t<true,_executor_type,_binder1<function<void_(const_error_code_&)>,_error_code>_>_>::value>
          *param_2,enable_if_t<_detail::is_work_dispatcher_required<decay_t<binder1<function<void_(const_error_code_&)>,_error_code>_>,_any_io_executor>::value>
                   *param_3)

{
  allocator_t<std::allocator<void>_> local_b1;
  enable_if_t<call_traits<impl,_any_io_executor,_void_(const_fork_t<>_&,_allocator_t<allocator<void>_>)>::overload____two_props,_typename_call_traits<impl,_any_io_executor,_void_(const_fork_t<>_&,_allocator_t<allocator<void>_>)>::result_type>
  local_b0;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> local_78;
  any_io_executor local_48;
  
  any_io_executor::require<asio::execution::detail::blocking::never_t<0>>
            (&local_48,&this->ex_,(never_t *)&execution::detail::blocking_t<0>::never,0);
  asio_prefer_fn::impl::operator()
            (&local_b0,(impl *)&asio_prefer_fn::static_instance<asio_prefer_fn::impl>::instance,
             &local_48,(fork_t<0> *)&execution::detail::relationship_t<0>::fork,&local_b1);
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>::binder1
            (&local_78,handler);
  execution::detail::any_executor_base::
  execute<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
            ((any_executor_base *)&local_b0,
             (binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
              *)&local_78);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_78);
  execution::detail::any_executor_base::~any_executor_base((any_executor_base *)&local_b0);
  execution::detail::any_executor_base::~any_executor_base((any_executor_base *)&local_48);
  return;
}

Assistant:

void operator()(CompletionHandler&& handler,
      enable_if_t<
        execution::is_executor<
          conditional_t<true, executor_type, CompletionHandler>
        >::value
      >* = 0,
      enable_if_t<
        !detail::is_work_dispatcher_required<
          decay_t<CompletionHandler>,
          Executor
        >::value
      >* = 0) const
  {
    associated_allocator_t<decay_t<CompletionHandler>> alloc(
        (get_associated_allocator)(handler));

    asio::prefer(
        asio::require(ex_, execution::blocking.never),
        execution::relationship.fork,
        execution::allocator(alloc)
      ).execute(
        asio::detail::bind_handler(
          static_cast<CompletionHandler&&>(handler)));
  }